

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall
CConnman::GetNodeStats(CConnman *this,vector<CNodeStats,_std::allocator<CNodeStats>_> *vstats)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer ppCVar3;
  CNode *this_00;
  uint32_t uVar4;
  pointer ppCVar5;
  pointer this_01;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock92;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (vstats->super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (vstats->super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = pCVar1;
  if (pCVar2 != pCVar1) {
    do {
      CNodeStats::~CNodeStats(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pCVar2);
    (vstats->super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>)._M_impl.
    super__Vector_impl_data._M_finish = pCVar1;
  }
  local_48._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  std::vector<CNodeStats,_std::allocator<CNodeStats>_>::reserve
            (vstats,(long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar5 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar5 != ppCVar3; ppCVar5 = ppCVar5 + 1) {
    this_00 = *ppCVar5;
    std::vector<CNodeStats,_std::allocator<CNodeStats>_>::emplace_back<>(vstats);
    CNode::CopyStats(this_00,(vstats->super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>).
                             _M_impl.super__Vector_impl_data._M_finish + -1);
    uVar4 = NetGroupManager::GetMappedAS(this->m_netgroupman,(CNetAddr *)&this_00->addr);
    (vstats->super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>)._M_impl.
    super__Vector_impl_data._M_finish[-1].m_mapped_as = uVar4;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::GetNodeStats(std::vector<CNodeStats>& vstats) const
{
    vstats.clear();
    LOCK(m_nodes_mutex);
    vstats.reserve(m_nodes.size());
    for (CNode* pnode : m_nodes) {
        vstats.emplace_back();
        pnode->CopyStats(vstats.back());
        vstats.back().m_mapped_as = GetMappedAS(pnode->addr);
    }
}